

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O2

boolean is_home_elemental(d_level *dlev,permonst *ptr)

{
  boolean bVar1;
  int iVar2;
  
  if (ptr->mlet == '\x1f') {
    iVar2 = monsndx(ptr);
    if (iVar2 - 0x9fU < 4) {
      bVar1 = on_level(dlev,(d_level *)
                            (&PTR_dungeon_topology_d_air_level_dnum_002ff490)[iVar2 - 0x9fU]);
      return bVar1;
    }
  }
  return '\0';
}

Assistant:

boolean is_home_elemental(const struct d_level *dlev, const struct permonst *ptr)
{
	if (ptr->mlet == S_ELEMENTAL)
	    switch (monsndx(ptr)) {
		case PM_AIR_ELEMENTAL: return Is_airlevel(dlev);
		case PM_FIRE_ELEMENTAL: return Is_firelevel(dlev);
		case PM_EARTH_ELEMENTAL: return Is_earthlevel(dlev);
		case PM_WATER_ELEMENTAL: return Is_waterlevel(dlev);
	    }
	return FALSE;
}